

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_cyberdemon.cpp
# Opt level: O2

int AF_A_CyberAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  PClassActor *type;
  AActor *self;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051f3ba;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0051f2ec:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051f3ba;
        }
      }
      if (numparam == 1) goto LAB_0051f360;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0051f3aa;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0051f3ba;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0051f3aa;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0051f360:
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)&self->target);
        if (pAVar3 != (AActor *)0x0) {
          A_FaceTarget(self);
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)&self->target);
          type = PClass::FindActor("Rocket");
          P_SpawnMissile(self,pAVar3,type,(AActor *)0x0);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0051f3ba;
    }
    if (self == (AActor *)0x0) goto LAB_0051f2ec;
  }
LAB_0051f3aa:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0051f3ba:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CyberAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	P_SpawnMissile (self, self->target, PClass::FindActor("Rocket"));
	return 0;
}